

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O0

void __thiscall
QDBusConnectionPrivate::disconnectRelay
          (QDBusConnectionPrivate *this,QString *service,QString *path,QString *interface,
          QDBusAbstractInterface *receiver,QMetaMethod *signal)

{
  bool bVar1;
  undefined4 uVar2;
  QString *key_00;
  QString *in_RCX;
  QString *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  SignalHook *in_R8;
  long in_FS_OFFSET;
  QString errorMsg;
  QByteArray sig;
  QString key;
  SignalHook hook;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *cat;
  SignalHook *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffd9c;
  QString *key_01;
  QDBusConnectionPrivate *in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb8;
  undefined1 buildSignature;
  undefined4 in_stack_fffffffffffffde8;
  uint uVar4;
  undefined4 in_stack_fffffffffffffdec;
  QDebug local_190;
  QLoggingCategory local_188 [3];
  ArgMatchRules *argMatch;
  QObject *receiver_00;
  char *signal_00;
  int in_stack_fffffffffffffed8;
  QString *in_stack_fffffffffffffee8;
  QByteArray local_110;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 local_e0 [184];
  undefined1 *local_28;
  undefined1 *local_20;
  long local_18;
  
  buildSignature = (undefined1)((ulong)in_stack_fffffffffffffdb8 >> 0x38);
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_e0,0xaa,0xb8);
  SignalHook::SignalHook(in_stack_fffffffffffffd80);
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x16f697);
  local_110.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_110.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_110.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x16f6d1);
  QByteArray::append((char)&local_110);
  QMetaMethod::methodSignature();
  QByteArray::append(&local_110);
  QByteArray::~QByteArray((QByteArray *)0x16f717);
  argMatch = (ArgMatchRules *)&DAT_aaaaaaaaaaaaaaaa;
  receiver_00 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  signal_00 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x16f751);
  QString::QString((QString *)0x16f785);
  memset(local_188,0,0x30);
  ArgMatchRules::ArgMatchRules((ArgMatchRules *)in_stack_fffffffffffffd80);
  key_00 = (QString *)QByteArray::operator_cast_to_char_((QByteArray *)0x16f7bb);
  uVar2 = QMetaObject::methodCount();
  cat = local_188;
  key_01 = (QString *)&stack0xfffffffffffffec0;
  uVar3 = 1;
  bVar1 = prepareHook((SignalHook *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                      key_00,in_RCX,in_RDX,in_RSI,in_RDI,argMatch,receiver_00,signal_00,
                      in_stack_fffffffffffffed8,(bool)buildSignature,in_stack_fffffffffffffee8);
  uVar4 = (uint)bVar1 << 0x18 ^ 0xff000000;
  ArgMatchRules::~ArgMatchRules((ArgMatchRules *)in_R8);
  QString::~QString((QString *)0x16f850);
  if ((uVar4 & 0x1000000) == 0) {
    removeSignalHook(in_stack_fffffffffffffda8,key_01,
                     (SignalHook *)CONCAT44(in_stack_fffffffffffffd9c,uVar3));
  }
  else {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    dbusIntegration();
    anon_unknown.dwarf_162961::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_R8,cat);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_162961::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x16f8b3);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffd94,uVar2),(char *)key_00,
                 (int)((ulong)in_R8 >> 0x20),(char *)cat,(char *)0x16f8cc);
      QMessageLogger::warning();
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd9c,uVar3),(char *)in_RSI);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd94,uVar2),key_00);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd9c,uVar3),(char *)in_RSI);
      QMetaMethod::methodSignature();
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd94,uVar2),(QByteArray *)key_00);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd9c,uVar3),(char *)in_RSI);
      QtPrivate::asString((QString *)&stack0xfffffffffffffec0);
      QString::toLocal8Bit((QString *)CONCAT44(in_stack_fffffffffffffd9c,uVar3));
      QByteArray::constData((QByteArray *)0x16f97b);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd9c,uVar3),(char *)in_RSI);
      QByteArray::~QByteArray((QByteArray *)0x16f995);
      QByteArray::~QByteArray((QByteArray *)0x16f9a2);
      QDebug::~QDebug(&local_190);
      local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
    }
  }
  QString::~QString((QString *)0x16f9f5);
  QByteArray::~QByteArray((QByteArray *)0x16fa02);
  QString::~QString((QString *)0x16fa0f);
  SignalHook::~SignalHook(in_R8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusConnectionPrivate::disconnectRelay(const QString &service,
                                             const QString &path, const QString &interface,
                                             QDBusAbstractInterface *receiver,
                                             const QMetaMethod &signal)
{
    // this function is called by QDBusAbstractInterface when one of its signals is disconnected
    // we remove relay from D-Bus into it
    SignalHook hook;
    QString key;

    QByteArray sig;
    sig.append(QSIGNAL_CODE + '0');
    sig.append(signal.methodSignature());
    QString errorMsg;
    if (!prepareHook(hook, key, service, path, interface, QString(), ArgMatchRules(), receiver, sig,
                     QDBusAbstractInterface::staticMetaObject.methodCount(), true, errorMsg)) {
        qCWarning(dbusIntegration) << "Could not disconnect" << interface << "to"
                                   << signal.methodSignature() << ":" << qPrintable(errorMsg);
        return;                 // don't disconnect
    }

    Q_ASSERT(thread() != QThread::currentThread());
    removeSignalHook(key, hook);
}